

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb_cpu_io.h
# Opt level: O0

void __thiscall Gbs_Emu::cpu_write(Gbs_Emu *this,gb_addr_t addr,int data)

{
  uint n;
  undefined4 in_EDX;
  uint in_ESI;
  Gbs_Emu *in_RDI;
  uint offset;
  uint in_stack_00000028;
  blip_time_t in_stack_0000002c;
  Gb_Apu *in_stack_00000030;
  
  n = in_ESI - 0xa000;
  if (n < 0x6000) {
    in_RDI->ram[n] = (byte)in_EDX;
    if ((in_ESI ^ 0xe000) < 0x1f80) {
      if (in_ESI - 0xff10 < 0x30) {
        clock(in_RDI);
        Gb_Apu::write_register(in_stack_00000030,in_stack_0000002c,in_stack_00000028,this._4_4_);
      }
      else if ((in_ESI ^ 0xff06) < 2) {
        update_timer((Gbs_Emu *)CONCAT44(in_ESI,in_EDX));
      }
      else if (in_ESI == 0xff00) {
        in_RDI->ram[n] = '\0';
      }
      else {
        in_RDI->ram[n] = 0xff;
      }
    }
  }
  else if ((in_ESI ^ 0x2000) < 0x2000) {
    set_bank((Gbs_Emu *)CONCAT44(in_ESI,in_EDX),n);
  }
  return;
}

Assistant:

void Gbs_Emu::cpu_write( gb_addr_t addr, int data )
{
	unsigned offset = addr - ram_addr;
	if ( offset <= 0xFFFF - ram_addr )
	{
		ram [offset] = data;
		if ( (addr ^ 0xE000) <= 0x1F80 - 1 )
		{
			if ( unsigned (addr - Gb_Apu::start_addr) < Gb_Apu::register_count )
			{
				GME_APU_HOOK( this, addr - Gb_Apu::start_addr, data );
				apu.write_register( clock(), addr, data );
			}
			else if ( (addr ^ 0xFF06) < 2 )
				update_timer();
			else if ( addr == joypad_addr )
				ram [offset] = 0; // keep joypad return value 0
			else
				ram [offset] = 0xFF;

			//if ( addr == 0xFFFF )
			//  debug_printf( "Wrote interrupt mask\n" );
		}
	}